

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

plutovg_path_t * plutovg_path_create(void)

{
  plutovg_path_t *ppVar1;
  
  ppVar1 = (plutovg_path_t *)malloc(0x28);
  ppVar1->ref_count = 1;
  ppVar1->num_points = 0;
  ppVar1->num_contours = 0;
  ppVar1->num_curves = 0;
  (ppVar1->start_point).x = 0.0;
  *(undefined8 *)&(ppVar1->start_point).y = 0;
  *(undefined8 *)((long)&(ppVar1->elements).data + 4) = 0;
  (ppVar1->elements).capacity = 0;
  return ppVar1;
}

Assistant:

plutovg_path_t* plutovg_path_create(void)
{
    plutovg_path_t* path = malloc(sizeof(plutovg_path_t));
    path->ref_count = 1;
    path->num_points = 0;
    path->num_contours = 0;
    path->num_curves = 0;
    path->start_point = PLUTOVG_EMPTY_POINT;
    plutovg_array_init(path->elements);
    return path;
}